

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O2

string * CLI::detail::remove_outer(string *str,char key)

{
  char *pcVar1;
  pointer pcVar2;
  
  if (((1 < str->_M_string_length) && (pcVar1 = (str->_M_dataplus)._M_p, *pcVar1 == key)) &&
     (pcVar1[str->_M_string_length - 1] == key)) {
    ::std::__cxx11::string::pop_back();
    pcVar2 = (str->_M_dataplus)._M_p;
    ::std::__cxx11::string::erase(str,pcVar2,pcVar2 + 1);
  }
  return str;
}

Assistant:

CLI11_INLINE std::string &remove_outer(std::string &str, char key) {
    if(str.length() > 1 && (str.front() == key)) {
        if(str.front() == str.back()) {
            str.pop_back();
            str.erase(str.begin(), str.begin() + 1);
        }
    }
    return str;
}